

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

void google::protobuf::compiler::objectivec::anon_unknown_0::PathSplit
               (string *path,string *directory,string *basename)

{
  long lVar1;
  string asStack_48 [32];
  
  lVar1 = std::__cxx11::string::rfind((char)path,0x2f);
  if (lVar1 == -1) {
    if (directory != (string *)0x0) {
      std::__cxx11::string::assign((char *)directory);
    }
    if (basename != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)basename);
      return;
    }
  }
  else {
    if (directory != (string *)0x0) {
      std::__cxx11::string::substr((ulong)asStack_48,(ulong)path);
      std::__cxx11::string::operator=((string *)directory,asStack_48);
      std::__cxx11::string::~string(asStack_48);
    }
    if (basename != (string *)0x0) {
      std::__cxx11::string::substr((ulong)asStack_48,(ulong)path);
      std::__cxx11::string::operator=((string *)basename,asStack_48);
      std::__cxx11::string::~string(asStack_48);
    }
  }
  return;
}

Assistant:

void PathSplit(const std::string& path, std::string* directory,
               std::string* basename) {
  std::string::size_type last_slash = path.rfind('/');
  if (last_slash == std::string::npos) {
    if (directory) {
      *directory = "";
    }
    if (basename) {
      *basename = path;
    }
  } else {
    if (directory) {
      *directory = path.substr(0, last_slash);
    }
    if (basename) {
      *basename = path.substr(last_slash + 1);
    }
  }
}